

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O2

int lisp_string_to_c_string(LispPTR Lisp,char *C,size_t length)

{
  uint uVar1;
  uint uVar2;
  LispPTR LVar3;
  DLword *pDVar4;
  LispPTR *pLVar5;
  size_t l;
  int iVar6;
  ulong uVar7;
  
  iVar6 = -1;
  if ((*(ushort *)((ulong)(Lisp >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 0xe) {
    pLVar5 = NativeAligned4FromLAddr(Lisp);
    pDVar4 = Lisp_world;
    uVar1 = pLVar5[2];
    if (((ulong)uVar1 < 0x14) && (*(char *)((long)pLVar5 + 6) == 'C')) {
      uVar2 = *pLVar5;
      LVar3 = pLVar5[1];
      for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
        C[uVar7] = *(char *)((long)pDVar4 +
                             uVar7 + (ulong)(ushort)LVar3 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3);
      }
      C[(int)pLVar5[2]] = '\0';
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int lisp_string_to_c_string(LispPTR Lisp, char *C, size_t length) {
  OneDArray *arrayp;
  char *base;

  if (GetTypeNumber(Lisp) != TYPE_ONED_ARRAY) { return (-1); }

  arrayp = (OneDArray *)NativeAligned4FromLAddr(Lisp);
  if (arrayp->fillpointer >= length) { return (-1); } /* too long */

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)NativeAligned2FromLAddr(arrayp->base)) + ((int)(arrayp->offset));
#ifndef BYTESWAP
      strncpy(C, base, arrayp->fillpointer);
#else
      {
        size_t l = arrayp->fillpointer;
        char *dp = C;
        for (size_t i = 0; i < l; i++) {
          *dp++ = (char)(GETBYTE(base++));
        }
      }
#endif /* BYTESWAP */

      C[arrayp->fillpointer] = '\0';
      return 0;
    default: return -1;
  }
}